

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_begin(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  
  iVar1 = unqlitePagerBegin(*(Pager **)(*pCtx->pFunc->pUserData + 0xd8));
  jx9_result_bool(pCtx,(uint)(iVar1 == 0));
  return 0;
}

Assistant:

static int unqliteBuiltin_db_begin(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_vm *pVm;
	unqlite *pDb;
	int rc;
	SXUNUSED(argc); /* cc warning */
	SXUNUSED(argv);
	/* Point to the unqlite Vm */
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Point to the underlying database handle  */
	pDb = pVm->pDb;
	/* Begin the transaction */
	rc = unqlitePagerBegin(pDb->sDB.pPager);
	/* result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK );
	return JX9_OK;
}